

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O1

void spirv_cross::inner::join_helper<std::__cxx11::string_const&,char&,char&,char_const(&)[2]>
               (StringStream<4096UL,_4096UL> *stream,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,char *ts,
               char *ts_1,char (*ts_2) [2])

{
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  StringStream<4096UL,_4096UL>::append(stream,(t->_M_dataplus)._M_p,t->_M_string_length);
  uStack_28 = CONCAT17(*ts,(undefined7)uStack_28);
  StringStream<4096UL,_4096UL>::append(stream,(char *)((long)&uStack_28 + 7),1);
  join_helper<char&,char_const(&)[2]>(stream,ts_1,ts_2);
  return;
}

Assistant:

void join_helper(StringStream<> &stream, T &&t, Ts &&... ts)
{
	stream << std::forward<T>(t);
	join_helper(stream, std::forward<Ts>(ts)...);
}